

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scaler.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::Scaler::_InternalParse(Scaler *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  RepeatedField<double> *pRVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  double dVar3;
  uint local_24;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  Scaler *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
LAB_003d3fcc:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)google::protobuf::internal::ReadTag((char *)ctx_local,&local_24,0);
    tag_00 = local_24;
    if (local_24 >> 3 == 1) {
      if ((local_24 & 0xff) != 10) {
        if ((local_24 & 0xff) != 9) goto LAB_003d40fc;
        dVar3 = google::protobuf::internal::UnalignedLoad<double>((char *)ctx_local);
        _internal_add_shiftvalue(this,dVar3);
        ctx_local = (ParseContext *)&(ctx_local->super_EpsCopyInputStream).buffer_end_;
        goto LAB_003d3fcc;
      }
      pRVar2 = _internal_mutable_shiftvalue(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::PackedDoubleParser
                            (pRVar2,(char *)ctx_local,pPStack_20);
    }
    else {
      if (local_24 >> 3 == 2) {
        if ((local_24 & 0xff) == 0x12) {
          pRVar2 = _internal_mutable_scalevalue(this);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::PackedDoubleParser
                                (pRVar2,(char *)ctx_local,pPStack_20);
          goto joined_r0x003d4163;
        }
        if ((local_24 & 0xff) == 0x11) {
          dVar3 = google::protobuf::internal::UnalignedLoad<double>((char *)ctx_local);
          _internal_add_scalevalue(this,dVar3);
          ctx_local = (ParseContext *)&(ctx_local->super_EpsCopyInputStream).buffer_end_;
          goto LAB_003d3fcc;
        }
      }
LAB_003d40fc:
      if ((local_24 == 0) || ((local_24 & 7) == 4)) {
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        google::protobuf::internal::EpsCopyInputStream::SetLastTag
                  (&pPStack_20->super_EpsCopyInputStream,local_24);
        return (char *)ctx_local;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>
                          (&(this->super_MessageLite)._internal_metadata_);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::UnknownFieldParse
                            (tag_00,unknown,(char *)ctx_local,pPStack_20);
    }
joined_r0x003d4163:
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Scaler::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated double shiftValue = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedDoubleParser(_internal_mutable_shiftvalue(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 9) {
          _internal_add_shiftvalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      // repeated double scaleValue = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedDoubleParser(_internal_mutable_scalevalue(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 17) {
          _internal_add_scalevalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}